

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_Create(SUNContext_conflict sunctx,MRIStepInnerStepper *stepper)

{
  void *pvVar1;
  long *in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x16;
  }
  else {
    *in_RSI = 0;
    pvVar1 = malloc(0x70);
    *in_RSI = (long)pvVar1;
    if (*in_RSI == 0) {
      arkProcessError((ARKodeMem)0x0,-0x14,0x108f,"MRIStepInnerStepper_Create",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Allocation of arkode_mem failed.");
      local_4 = -0x14;
    }
    else {
      memset((void *)*in_RSI,0,0x70);
      pvVar1 = malloc(0x30);
      *(void **)(*in_RSI + 8) = pvVar1;
      if (*(long *)(*in_RSI + 8) == 0) {
        arkProcessError((ARKodeMem)0x0,-0x14,0x1098,"MRIStepInnerStepper_Create",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Allocation of arkode_mem failed.");
        free((void *)*in_RSI);
        local_4 = -0x14;
      }
      else {
        memset(*(void **)(*in_RSI + 8),0,0x30);
        *(undefined4 *)(*in_RSI + 0x28) = 0;
        *(long *)(*in_RSI + 0x10) = in_RDI;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_Create(SUNContext sunctx, MRIStepInnerStepper* stepper)
{
  if (!sunctx) { return ARK_ILL_INPUT; }

  *stepper = NULL;
  *stepper = (MRIStepInnerStepper)malloc(sizeof(**stepper));
  if (*stepper == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  memset(*stepper, 0, sizeof(**stepper));

  (*stepper)->ops = (MRIStepInnerStepper_Ops)malloc(sizeof(*((*stepper)->ops)));
  if ((*stepper)->ops == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    free(*stepper);
    return (ARK_MEM_FAIL);
  }
  memset((*stepper)->ops, 0, sizeof(*((*stepper)->ops)));

  /* initialize stepper data */
  (*stepper)->last_flag = ARK_SUCCESS;
  (*stepper)->sunctx    = sunctx;

  return (ARK_SUCCESS);
}